

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.h
# Opt level: O3

bool __thiscall
chrono::fea::ChElementShellANCF_3833::IsSubBlockActive(ChElementShellANCF_3833 *this,int nblock)

{
  byte bVar1;
  
  bVar1 = (**(code **)(*(long *)&((this->m_nodes).
                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[nblock].
                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->super_ChNodeFEAxyzD + 0x18))();
  return (bool)(bVar1 ^ 1);
}

Assistant:

virtual bool IsSubBlockActive(int nblock) const override { return !m_nodes[nblock]->GetFixed(); }